

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.c
# Opt level: O0

rxc_source * rxc_source_count(long from,long to)

{
  rxc_source_count *source;
  long to_local;
  long from_local;
  
  from_local = (long)malloc(0x20);
  if ((undefined8 *)from_local == (undefined8 *)0x0) {
    from_local = 0;
  }
  else {
    *(long *)(from_local + 0x10) = from;
    *(long *)(from_local + 0x18) = to;
    *(code **)from_local = dealloc;
    *(code **)(from_local + 8) = connect;
  }
  return (rxc_source *)from_local;
}

Assistant:

struct rxc_source * rxc_source_count(long from, long to)
{
    struct rxc_source_count *source = malloc(sizeof(struct rxc_source_count));

    if (!source) {
        return NULL;
    }

    source->from = from;
    source->to = to;

    source->base.dealloc = dealloc;
    source->base.connect = connect;

    return &source->base;
}